

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i64 gen_ext_tl(TCGContext *tcg_ctx,TCGv_i64 dst,TCGv_i64 src,MemOp size,_Bool sign)

{
  if (size == MO_32) {
    if (sign) {
      tcg_gen_ext32s_i64_x86_64(tcg_ctx,dst,src);
      src = dst;
    }
    else {
      tcg_gen_ext32u_i64_x86_64(tcg_ctx,dst,src);
      src = dst;
    }
  }
  else if (size == MO_16) {
    if (sign) {
      tcg_gen_ext16s_i64_x86_64(tcg_ctx,dst,src);
      src = dst;
    }
    else {
      tcg_gen_ext16u_i64_x86_64(tcg_ctx,dst,src);
      src = dst;
    }
  }
  else if (size == MO_8) {
    if (sign) {
      tcg_gen_ext8s_i64_x86_64(tcg_ctx,dst,src);
      src = dst;
    }
    else {
      tcg_gen_ext8u_i64_x86_64(tcg_ctx,dst,src);
      src = dst;
    }
  }
  return src;
}

Assistant:

static TCGv gen_ext_tl(TCGContext *tcg_ctx, TCGv dst, TCGv src, MemOp size, bool sign)
{
    switch (size) {
    case MO_8:
        if (sign) {
            tcg_gen_ext8s_tl(tcg_ctx, dst, src);
        } else {
            tcg_gen_ext8u_tl(tcg_ctx, dst, src);
        }
        return dst;
    case MO_16:
        if (sign) {
            tcg_gen_ext16s_tl(tcg_ctx, dst, src);
        } else {
            tcg_gen_ext16u_tl(tcg_ctx, dst, src);
        }
        return dst;
#ifdef TARGET_X86_64
    case MO_32:
        if (sign) {
            tcg_gen_ext32s_tl(tcg_ctx, dst, src);
        } else {
            tcg_gen_ext32u_tl(tcg_ctx, dst, src);
        }
        return dst;
#endif
    default:
        return src;
    }
}